

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Collision_Elastic_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Collision_Elastic_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KStringStream ss;
  KString local_2e0;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Collision Elastic PDU-\n");
  poVar1 = std::operator<<(poVar1,"Issuing Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_IssuingEntityID);
  UTILS::IndentString(&local_1e0,&local_200,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Colliding Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_240,&this->m_CollidingEntityID);
  UTILS::IndentString(&local_220,&local_240,Tabs_00,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_280,&this->m_EventID);
  UTILS::IndentString(&local_260,&local_280,Tabs_01,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"ContactVelocity:       ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2a0,&this->m_ContactVelocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  poVar1 = std::operator<<(poVar1,"Mass (KG):             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Mass);
  poVar1 = std::operator<<(poVar1,"\nLocation (With Respect To Entity): ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2c0,&this->m_Location);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  poVar1 = std::operator<<(poVar1,"Collision Intermediate Result:\n");
  poVar1 = std::operator<<(poVar1,"XX : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXX);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"XY : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXY);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"XZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"YY : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRYY);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"YZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRYZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"ZZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRZZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Unit Surface Normal:  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2e0,&this->m_UnitSurfaceNormal);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
  poVar1 = std::operator<<(poVar1,"Coeffcient Of Resititution:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32COR);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Collision_Elastic_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Collision Elastic PDU-\n"
       << "Issuing Entity ID:\n"
       << IndentString( m_IssuingEntityID.GetAsString(), 1 )
       << "Colliding Entity ID:\n"
       << IndentString( m_CollidingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "ContactVelocity:       " << m_ContactVelocity.GetAsString()
       << "Mass (KG):             " << m_f32Mass
       << "\nLocation (With Respect To Entity): " << m_Location.GetAsString()
       << "Collision Intermediate Result:\n"
       << "XX : " << m_f32CIRXX << "\n"
       << "XY : " << m_f32CIRXY << "\n"
       << "XZ : " << m_f32CIRXZ << "\n"
       << "YY : " << m_f32CIRYY << "\n"
       << "YZ : " << m_f32CIRYZ << "\n"
       << "ZZ : " << m_f32CIRZZ << "\n"
       << "Unit Surface Normal:  " << m_UnitSurfaceNormal.GetAsString()
       << "Coeffcient Of Resititution:   " << m_f32COR
       << "\n";

    return ss.str();
}